

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

FtpSession * __thiscall
fineftp::FtpSession::toAbsoluteFtpPath(FtpSession *this,string *rel_or_abs_ftp_path)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78;
  string local_58;
  undefined1 local_21;
  string *local_20;
  string *rel_or_abs_ftp_path_local;
  FtpSession *this_local;
  string *absolute_ftp_path;
  
  local_21 = 0;
  local_20 = in_RDX;
  rel_or_abs_ftp_path_local = rel_or_abs_ftp_path;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  uVar1 = ::std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar2 == '/')) {
    ::std::__cxx11::string::operator=((string *)this,local_20);
  }
  else {
    ::std::operator+(local_98,(char *)(rel_or_abs_ftp_path + 0x298));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     local_98);
    Filesystem::cleanPath(&local_58,&local_78,false,'/');
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  return this;
}

Assistant:

std::string FtpSession::toAbsoluteFtpPath(const std::string& rel_or_abs_ftp_path) const
  {
    std::string absolute_ftp_path;

    if (!rel_or_abs_ftp_path.empty() && (rel_or_abs_ftp_path[0] == '/'))
    {
      absolute_ftp_path = rel_or_abs_ftp_path;
    }
    else
    {
      absolute_ftp_path = fineftp::Filesystem::cleanPath(ftp_working_directory_ + "/" + rel_or_abs_ftp_path, false, '/');
    }

    return absolute_ftp_path;
  }